

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O1

MPP_RET mpp_create(MppCtx *ctx,MppApi **mpi)

{
  undefined8 *ctx_00;
  Mpp *this;
  MPP_RET MVar1;
  
  mpp_env_get_u32("mpi_debug",&mpi_debug,0);
  mpp_get_log_level();
  if (ctx == (MppCtx *)0x0 || mpi == (MppApi **)0x0) {
    _mpp_log_l(2,"mpi","invalid input ctx %p mpi %p\n","mpp_create",ctx,mpi);
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    *ctx = (MppCtx)0x0;
    *mpi = (MppApi *)0x0;
    if (((byte)mpi_debug & 1) != 0) {
      _mpp_log_l(4,"mpi","enter ctx %p mpi %p\n","mpp_create",ctx,mpi);
    }
    ctx_00 = (undefined8 *)mpp_osal_malloc("mpp_create",0x20);
    if (ctx_00 == (undefined8 *)0x0) {
      _mpp_log_l(2,"mpi","failed to allocate context\n","mpp_create");
      MVar1 = MPP_ERR_MALLOC;
    }
    else {
      ctx_00[2] = 0;
      ctx_00[3] = 0;
      *ctx_00 = 0;
      ctx_00[1] = 0;
      this = (Mpp *)operator_new(0x1a8);
      Mpp::Mpp(this,ctx_00);
      ctx_00[3] = this;
      mpp_api.version = 0;
      ctx_00[2] = &mpp_api;
      *ctx_00 = ctx_00;
      *ctx = ctx_00;
      *mpi = (MppApi *)ctx_00[2];
      MVar1 = MPP_OK;
    }
    show_mpp_version();
    if (((byte)mpi_debug & 1) != 0) {
      _mpp_log_l(4,"mpi","leave ret %d ctx %p mpi %p\n","mpp_create",(ulong)(uint)MVar1,*ctx,*mpi);
    }
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_create(MppCtx *ctx, MppApi **mpi)
{
    mpp_env_get_u32("mpi_debug", &mpi_debug, 0);
    mpp_get_log_level();

    if (NULL == ctx || NULL == mpi) {
        mpp_err_f("invalid input ctx %p mpi %p\n", ctx, mpi);
        return MPP_ERR_NULL_PTR;
    }

    *ctx = NULL;
    *mpi = NULL;

    MPP_RET ret = MPP_OK;
    mpi_dbg_func("enter ctx %p mpi %p\n", ctx, mpi);
    do {
        MpiImpl *p = mpp_malloc(MpiImpl, 1);
        if (NULL == p) {
            mpp_err_f("failed to allocate context\n");
            ret = MPP_ERR_MALLOC;
            break;
        }

        memset(p, 0, sizeof(*p));
        p->ctx = new Mpp(p);
        if (NULL == p->ctx) {
            mpp_free(p);
            mpp_err_f("failed to new Mpp\n");
            ret = MPP_ERR_MALLOC;
            break;
        }

        mpp_api.version = 0;
        p->api      = &mpp_api;
        p->check    = p;
        *ctx = p;
        *mpi = p->api;
    } while (0);

    show_mpp_version();

    mpi_dbg_func("leave ret %d ctx %p mpi %p\n", ret, *ctx, *mpi);
    return ret;
}